

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  OneofOptions *msg;
  UnknownFieldSet *unknown;
  ulong tag_00;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = internal::ReadTag(local_40,&local_34,0);
      tag_00 = (ulong)local_34;
      if (local_34 >> 3 == 2) break;
      if ((local_34 >> 3 != 1) || ((char)local_34 != '\n')) goto LAB_0037a1ce;
      s = _internal_mutable_name_abi_cxx11_(this);
      local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
      internal::VerifyUTF8(s,"google.protobuf.OneofDescriptorProto.name");
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((char)local_34 == '\x12') {
      msg = _internal_mutable_options(this);
      local_40 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg,local_40);
    }
    else {
LAB_0037a1ce:
      if ((tag_00 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = internal::InternalMetadata::
                mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                          (&(this->super_Message).super_MessageLite._internal_metadata_);
      local_40 = internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.OneofDescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}